

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O2

void sptk::world::anon_unknown_5::GetMultiChannelF0
               (double *f0,int f0_length,int *boundary_list,int number_of_boundaries,
               double **multi_channel_f0)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int j;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  uVar2 = (long)number_of_boundaries / 2 & 0xffffffff;
  uVar4 = 0;
  if ((int)((long)number_of_boundaries / 2) < 1) {
    uVar2 = 0;
  }
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    uVar1 = boundary_list[uVar4 * 2];
    lVar5 = (long)(int)uVar1;
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
      multi_channel_f0[uVar4][uVar3] = 0.0;
    }
    lVar6 = (long)boundary_list[uVar4 * 2 + 1];
    for (; lVar5 <= lVar6; lVar5 = lVar5 + 1) {
      multi_channel_f0[uVar4][lVar5] = f0[lVar5];
    }
    while (lVar6 = lVar6 + 1, lVar6 < f0_length) {
      multi_channel_f0[uVar4][lVar6] = 0.0;
    }
  }
  return;
}

Assistant:

static void GetMultiChannelF0(const double *f0, int f0_length,
    const int *boundary_list, int number_of_boundaries,
    double **multi_channel_f0) {
  for (int i = 0; i < number_of_boundaries / 2; ++i) {
    for (int j = 0; j < boundary_list[i * 2]; ++j)
      multi_channel_f0[i][j] = 0.0;
    for (int j = boundary_list[i * 2]; j <= boundary_list[i * 2 + 1]; ++j)
      multi_channel_f0[i][j] = f0[j];
    for (int j = boundary_list[i * 2 + 1] + 1; j < f0_length; ++j)
      multi_channel_f0[i][j] = 0.0;
  }
}